

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

string * __thiscall
cmState::ModeToString_abi_cxx11_(string *__return_storage_ptr__,cmState *this,Mode mode)

{
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  undefined4 local_14;
  string *psStack_10;
  Mode mode_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UNKNOWN",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"PROJECT",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"SCRIPT",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"FIND_PACKAGE",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"CTEST",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"CPACK",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"HELP",&local_29);
    std::allocator<char>::~allocator(&local_29);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UNKNOWN",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmState::ModeToString(cmState::Mode mode)
{
  switch (mode) {
    case Project:
      return "PROJECT";
    case Script:
      return "SCRIPT";
    case FindPackage:
      return "FIND_PACKAGE";
    case CTest:
      return "CTEST";
    case CPack:
      return "CPACK";
    case Help:
      return "HELP";
    case Unknown:
      return "UNKNOWN";
  }
  return "UNKNOWN";
}